

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

string * __thiscall
cmUuid::FromDigest_abi_cxx11_
          (string *__return_storage_ptr__,cmUuid *this,uchar *digest,uchar version)

{
  byte bVar1;
  undefined8 local_38;
  byte_t uuid [16];
  uchar version_local;
  uchar *digest_local;
  cmUuid *this_local;
  
  uuid[0xf] = version;
  memset(&local_38,0,0x10);
  local_38 = *(ulong *)digest & 0xff0fffffffffffff;
  bVar1 = local_38._6_1_ | uuid[0xf] << 4;
  local_38._0_7_ = CONCAT16(bVar1,(undefined6)local_38);
  uuid._0_8_ = *(ulong *)(digest + 8) & 0xffffffffffffff3f;
  uuid._0_8_ = uuid._0_8_ | 0x80;
  BinaryToString_abi_cxx11_(__return_storage_ptr__,this,(uchar *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::FromDigest(const unsigned char* digest,
                               unsigned char version) const
{
  typedef unsigned char byte_t;

  byte_t uuid[16] = { 0 };
  memcpy(uuid, digest, 16);

  uuid[6] &= 0xF;
  uuid[6] |= byte_t(version << 4);

  uuid[8] &= 0x3F;
  uuid[8] |= 0x80;

  return this->BinaryToString(uuid);
}